

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.cpp
# Opt level: O2

void duckdb_brotli::BrotliDecoderStateCleanup(BrotliDecoderStateInternal *s)

{
  BrotliDecoderStateCleanupAfterMetablock(s);
  (*s->free_func)(s->memory_manager_opaque,s->compound_dictionary);
  s->compound_dictionary = (BrotliDecoderCompoundDictionary *)0x0;
  BrotliSharedDictionaryDestroyInstance(s->dictionary);
  s->dictionary = (BrotliSharedDictionary *)0x0;
  (*s->free_func)(s->memory_manager_opaque,s->ringbuffer);
  s->ringbuffer = (uint8_t *)0x0;
  (*s->free_func)(s->memory_manager_opaque,s->block_type_trees);
  s->block_type_trees = (HuffmanCode *)0x0;
  return;
}

Assistant:

void duckdb_brotli::BrotliDecoderStateCleanup(BrotliDecoderState* s) {
  BrotliDecoderStateCleanupAfterMetablock(s);

  BROTLI_DECODER_ON_FINISH(s);

  BROTLI_DECODER_FREE(s, s->compound_dictionary);
  BrotliSharedDictionaryDestroyInstance(s->dictionary);
  s->dictionary = NULL;
  BROTLI_DECODER_FREE(s, s->ringbuffer);
  BROTLI_DECODER_FREE(s, s->block_type_trees);
}